

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O3

feed_db_status_t store_fare_attributes_db(fare_attributes_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  sqlite3_stmt *stmt;
  char qr [152];
  sqlite3_stmt *local_d0;
  char local_c8 [160];
  
  memcpy(local_c8,
         "INSERT INTO fare_attributes (fare_id, price, currency_type, payment_method,transfers, agency_id, transfer_duration) values (?1, ?2, ?3, ?4,?5, ?6, ?7);"
         ,0x98);
  sqlite3_prepare_v2(db->conn,local_c8,-1,&local_d0,(char **)0x0);
  sqlite3_bind_text(local_d0,1,record->fare_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_double(local_d0,2,record->price);
  sqlite3_bind_text(local_d0,3,record->currency_type,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_d0,4,record->payment_method);
  sqlite3_bind_int(local_d0,5,record->transfers);
  sqlite3_bind_text(local_d0,6,record->agency_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_double(local_d0,7,record->transfer_duration);
  iVar1 = sqlite3_step(local_d0);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(local_d0);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_fare_attributes_db(fare_attributes_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO fare_attributes ("
                    "fare_id, price, currency_type, payment_method,"
                    "transfers, agency_id, transfer_duration"
                ") values ("
                    "?1, ?2, ?3, ?4,"
                    "?5, ?6, ?7"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->fare_id, -1, SQLITE_STATIC);
    sqlite3_bind_double(stmt, 2, record->price);
    sqlite3_bind_text(stmt, 3, record->currency_type, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 4, (int)record->payment_method);
    sqlite3_bind_int(stmt, 5, (int)record->transfers);
    sqlite3_bind_text(stmt, 6, record->agency_id, -1, SQLITE_STATIC);
    sqlite3_bind_double(stmt, 7, record->transfer_duration);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}